

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_pick(curl_hash *h,void *key,size_t key_len)

{
  curl_llist **ppcVar1;
  curl_llist_element *pcVar2;
  undefined8 *puVar3;
  size_t sVar4;
  void *pvVar5;
  curl_llist *pcVar6;
  
  if (h == (curl_hash *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    ppcVar1 = h->table;
    sVar4 = (*h->hash_func)(key,key_len,(long)h->slots);
    pcVar6 = ppcVar1[sVar4];
    do {
      pcVar2 = pcVar6->head;
      if (pcVar2 == (curl_llist_element *)0x0) {
        return (void *)0x0;
      }
      puVar3 = (undefined8 *)pcVar2->ptr;
      sVar4 = (*h->comp_func)((void *)puVar3[1],puVar3[2],key,key_len);
      pcVar6 = (curl_llist *)&pcVar2->next;
    } while (sVar4 == 0);
    pvVar5 = (void *)*puVar3;
  }
  return pvVar5;
}

Assistant:

void *
Curl_hash_pick(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_hash_element  *he;
  struct curl_llist *l;

  if(h) {
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}